

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

void __thiscall QCompletionEngine::filter(QCompletionEngine *this,QStringList *parts)

{
  QMatchData *this_00;
  QModelIndex *pQVar1;
  long lVar2;
  QString *pQVar3;
  undefined8 uVar4;
  QIndexMapper *pQVar5;
  int iVar6;
  bool bVar7;
  long *plVar8;
  long lVar9;
  long lVar10;
  long in_FS_OFFSET;
  QIndexMapper local_b8;
  undefined8 local_88;
  undefined8 uStack_80;
  QAbstractItemModel *pQStack_78;
  QMatchData local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar8 = (long *)QAbstractProxyModel::sourceModel();
  QArrayDataPointer<QString>::operator=(&(this->curParts).d,&parts->d);
  if ((this->curParts).d.size == 0) {
    local_68.indices._0_8_ = 0;
    local_68.indices.vector.d.d = (Data *)0x0;
    local_68.indices.vector.d.ptr._0_4_ = 0;
    local_68.indices.vector.d.ptr._4_4_ = 0;
    QList<QString>::emplaceBack<QString>(&this->curParts,(QString *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  }
  this->curRow = -1;
  (this->curParent).r = -1;
  (this->curParent).c = -1;
  (this->curParent).i = 0;
  (this->curParent).m.ptr = (QAbstractItemModel *)0x0;
  local_68.indices._0_8_ = local_68.indices._0_8_ & 0xffffffffffffff00;
  local_68.indices.vector.d.d = (Data *)0x0;
  local_68.indices.vector.d.ptr._0_4_ = 0;
  local_68.indices.vector.d.ptr._4_4_ = 0;
  local_68.indices.vector.d.size._0_4_ = 0;
  local_68.indices._28_8_ = 0;
  local_68.indices.t = -1;
  local_68.exactMatchIndex = -1;
  local_68.partial = false;
  this_00 = &this->curMatch;
  QMatchData::operator=(this_00,&local_68);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_68.indices.vector.d);
  filterHistory(&local_68,this);
  QMatchData::operator=(&this->historyMatch,&local_68);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_68.indices.vector.d);
  if (plVar8 != (long *)0x0) {
    pQVar1 = &this->curParent;
    local_88 = 0xffffffffffffffff;
    uStack_80 = (Data *)0x0;
    pQStack_78 = (QAbstractItemModel *)0x0;
    lVar10 = 0x10;
    for (lVar9 = 0; lVar2 = (this->curParts).d.size, lVar9 < lVar2 + -1; lVar9 = lVar9 + 1) {
      pQVar3 = (this->curParts).d.ptr;
      local_b8._0_8_ = *(undefined8 *)((long)pQVar3 + lVar10 + -0x10);
      local_b8.vector.d.d = *(Data **)((long)pQVar3 + lVar10 + -8);
      uVar4 = *(undefined8 *)((long)&(pQVar3->d).d + lVar10);
      local_b8.vector.d.ptr._0_4_ = (undefined4)uVar4;
      local_b8.vector.d.ptr._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
      if ((Data *)local_b8._0_8_ != (Data *)0x0) {
        LOCK();
        *(int *)&((Data *)local_b8._0_8_)->super_QArrayData =
             *(int *)&((Data *)local_b8._0_8_)->super_QArrayData + 1;
        UNLOCK();
      }
      (*this->_vptr_QCompletionEngine[3])
                (&local_68,this,(QArrayDataPointer<char16_t> *)&local_b8,&local_88,
                 0xffffffffffffffff);
      iVar6 = local_68.exactMatchIndex;
      QArrayDataPointer<int>::~QArrayDataPointer(&local_68.indices.vector.d);
      if (iVar6 == -1) {
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
        goto LAB_005d143e;
      }
      (**(code **)(*plVar8 + 0x60))(&local_68,plVar8,iVar6,this->c->column,&local_88);
      pQStack_78 = (QAbstractItemModel *)
                   CONCAT44(local_68.indices.vector.d.ptr._4_4_,local_68.indices.vector.d.ptr._0_4_)
      ;
      local_88 = local_68.indices._0_8_;
      uStack_80 = local_68.indices.vector.d.d;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
      lVar10 = lVar10 + 0x18;
    }
    (this->curParent).m.ptr = pQStack_78;
    pQVar1->r = (int)local_88;
    (this->curParent).c = local_88._4_4_;
    *(undefined4 *)&(this->curParent).i = (undefined4)uStack_80;
    *(undefined4 *)((long)&(this->curParent).i + 4) = uStack_80._4_4_;
    pQVar3 = (this->curParts).d.ptr;
    if (pQVar3[lVar2 + -1].d.size == 0) {
      local_b8.t = (**(code **)(*plVar8 + 0x78))(plVar8,pQVar1);
      local_b8.t = local_b8.t + -1;
      pQVar5 = &local_b8;
      local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
      local_b8.vector.d.d = (Data *)0x0;
      local_b8.vector.d.ptr._0_4_ = 0;
      local_b8.vector.d.ptr._4_4_ = 0;
      local_b8.vector.d.size._0_4_ = 0;
      local_b8._28_8_ = 0;
      QIndexMapper::QIndexMapper(&local_68.indices,&local_b8);
      local_68.exactMatchIndex = -1;
      local_68.partial = false;
      QMatchData::operator=(this_00,&local_68);
      QArrayDataPointer<int>::~QArrayDataPointer(&local_68.indices.vector.d);
    }
    else {
      (*this->_vptr_QCompletionEngine[3])(&local_68,this,pQVar3 + lVar2 + -1,pQVar1,1);
      QMatchData::operator=(this_00,&local_68);
      pQVar5 = &local_68.indices;
    }
    QArrayDataPointer<int>::~QArrayDataPointer(&(pQVar5->vector).d);
    bVar7 = QIndexMapper::isValid(&this_00->indices);
    this->curRow = bVar7 - 1;
  }
LAB_005d143e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCompletionEngine::filter(const QStringList& parts)
{
    const QAbstractItemModel *model = c->proxy->sourceModel();
    curParts = parts;
    if (curParts.isEmpty())
        curParts.append(QString());

    curRow = -1;
    curParent = QModelIndex();
    curMatch = QMatchData();
    historyMatch = filterHistory();

    if (!model)
        return;

    QModelIndex parent;
    for (int i = 0; i < curParts.size() - 1; i++) {
        QString part = curParts.at(i);
        int emi = filter(part, parent, -1).exactMatchIndex;
        if (emi == -1)
            return;
        parent = model->index(emi, c->column, parent);
    }

    // Note that we set the curParent to a valid parent, even if we have no matches
    // When filtering is disabled, we show all the items under this parent
    curParent = parent;
    if (curParts.constLast().isEmpty())
        curMatch = QMatchData(QIndexMapper(0, model->rowCount(curParent) - 1), -1, false);
    else
        curMatch = filter(curParts.constLast(), curParent, 1); // build at least one
    curRow = curMatch.isValid() ? 0 : -1;
}